

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-write-fail.c
# Opt level: O1

void connect_cb(uv_connect_t *req,int status)

{
  int iVar1;
  void *pvVar2;
  undefined8 *extraout_RDX;
  long lVar3;
  undefined4 in_register_00000034;
  code *__size;
  uv_shutdown_t *puVar4;
  uv_stream_t *handle;
  long lVar5;
  uv_buf_t uVar6;
  uv_buf_t send_bufs [4096];
  uv_buf_t auStack_10038 [4096];
  
  handle = connect_req.handle;
  __size = (code *)CONCAT44(in_register_00000034,status);
  if (req == &connect_req) {
    if (status != 0) goto LAB_001728bd;
    connect_cb_called = connect_cb_called + 1;
    lVar5 = 0;
    do {
      lVar3 = 0;
      do {
        uVar6 = uv_buf_init(send_buffer + bytes_sent,0x2728);
        bytes_sent = bytes_sent + 0x2728;
        *(char **)((long)&auStack_10038[0].base + lVar3) = uVar6.base;
        *(size_t *)((long)&auStack_10038[0].len + lVar3) = uVar6.len;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x10000);
      req = (uv_connect_t *)(write_reqs + lVar5);
      __size = (code *)handle;
      iVar1 = uv_write((uv_write_t *)req,handle,auStack_10038,0x1000,write_cb);
      if (iVar1 != 0) {
        connect_cb_cold_3();
        goto LAB_001728b8;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    puVar4 = &shutdown_req;
    __size = (code *)handle;
    iVar1 = uv_shutdown(&shutdown_req,handle,shutdown_cb);
    req = (uv_connect_t *)puVar4;
    if (iVar1 != 0) goto LAB_001728c2;
    __size = alloc_cb;
    iVar1 = uv_read_start(handle,alloc_cb,read_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
LAB_001728b8:
    connect_cb_cold_1();
LAB_001728bd:
    connect_cb_cold_2();
LAB_001728c2:
    handle = (uv_stream_t *)req;
    connect_cb_cold_4();
  }
  connect_cb_cold_5();
  if (handle == (uv_stream_t *)0x0) {
    write_cb_cold_2();
  }
  else if ((int)__size == 0) {
    bytes_sent_done = bytes_sent_done + 0x2728000;
    write_cb_called = write_cb_called + 1;
    return;
  }
  puVar4 = (uv_shutdown_t *)((ulong)__size & 0xffffffff);
  write_cb_cold_1();
  if (puVar4 == &shutdown_req) {
    if ((int)__size != 0) goto LAB_0017292a;
    if ((shutdown_req.handle)->write_queue_size == 0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      if (write_cb_called == 3) {
        return;
      }
      goto LAB_00172934;
    }
  }
  else {
    shutdown_cb_cold_1();
LAB_0017292a:
    shutdown_cb_cold_2();
  }
  shutdown_cb_cold_3();
LAB_00172934:
  shutdown_cb_cold_4();
  pvVar2 = malloc((size_t)__size);
  *extraout_RDX = pvVar2;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void connect_cb(uv_connect_t* req, int status) {
  uv_buf_t buf;
  uv_stream_t* stream;
  int r;

  ASSERT(req == &connect_req);
  ASSERT(status == 0);

  stream = req->handle;
  connect_cb_called++;

  /* close the socket, the hard way */
  close_socket((uv_tcp_t*)stream);

  buf = uv_buf_init("hello\n", 6);
  r = uv_write(&write_req, stream, &buf, 1, write_cb);
  ASSERT(r == 0);
}